

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
* __thiscall
EOPlus::Parser::ParseStateBlock_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
           *__return_storage_ptr__,Parser *this)

{
  Parser_Token_Server_Base *pPVar1;
  bool bVar2;
  int iVar3;
  runtime_error *prVar4;
  long *plVar5;
  size_type *psVar6;
  Token *t_00;
  Token *t_01;
  int iVar7;
  string name;
  bool has_desc;
  Token t;
  State state;
  string local_340;
  string local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  string local_2f8;
  _Any_data local_2d8;
  code *local_2c8;
  code *pcStack_2c0;
  undefined1 local_2b8 [24];
  _Alloc_hider local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  bool local_280;
  bool bStack_27f;
  bool bStack_27e;
  bool bStack_27d;
  bool bStack_27c;
  undefined3 uStack_27b;
  var_type local_278;
  int local_270;
  _Any_data local_268;
  code *local_258;
  code *pcStack_250;
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  string local_220;
  State local_200;
  variant local_110;
  Token local_d0;
  Token local_80;
  
  util::variant::variant(&local_110);
  local_2b8._0_4_ = Invalid;
  local_2b8._8_4_ = local_110.val_int;
  local_2b8._12_4_ = local_110._4_4_;
  local_2b8._16_4_ = local_110.val_float._0_4_;
  local_2b8._20_4_ = local_110.val_float._4_4_;
  local_300 = &local_290;
  local_2a0._M_p = (pointer)local_300;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_110.val_string._M_dataplus._M_p,
             local_110.val_string._M_dataplus._M_p + local_110.val_string._M_string_length);
  local_278 = local_110.type;
  local_280 = local_110.val_bool;
  bStack_27f = local_110.cache_val[0];
  bStack_27e = local_110.cache_val[1];
  bStack_27d = local_110.cache_val[2];
  bStack_27c = local_110.cache_val[3];
  uStack_27b = local_110._53_3_;
  local_270 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.val_string._M_dataplus._M_p != &local_110.val_string.field_2) {
    operator_delete(local_110.val_string._M_dataplus._M_p,
                    local_110.val_string.field_2._M_allocated_capacity + 1);
  }
  bVar2 = GetToken(this,(Token *)local_2b8,1);
  if (!bVar2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x18);
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f8,"Expected state-name after \'state\'.","");
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    local_340._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_340._M_dataplus._M_p == psVar6) {
      local_340.field_2._M_allocated_capacity = *psVar6;
      local_340.field_2._8_8_ = plVar5[3];
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    }
    else {
      local_340.field_2._M_allocated_capacity = *psVar6;
    }
    local_340._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Parser_Token_Server_Base::RejectToken
              (&local_d0,
               (this->tok)._M_t.
               super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ._M_t.
               super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
    token_got_string_abi_cxx11_(&local_320,(EOPlus *)&local_d0,t_00);
    std::operator+(&local_200.name,&local_340,&local_320);
    pPVar1 = (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
    iVar3 = pPVar1->line;
    iVar7 = pPVar1->reject_line;
    std::runtime_error::runtime_error(prVar4,(string *)&local_200);
    if (iVar7 < iVar3) {
      iVar7 = iVar3;
    }
    *(int *)(prVar4 + 0x10) = iVar7;
    *(undefined ***)prVar4 = &PTR__runtime_error_001d37c8;
    __cxa_throw(prVar4,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
  }
  util::variant::GetString_abi_cxx11_(&local_340,(variant *)(local_2b8 + 8));
  bVar2 = GetToken(this,(Token *)local_2b8,0x40);
  if (bVar2) {
    util::variant::GetString_abi_cxx11_(&local_2f8,(variant *)(local_2b8 + 8));
    iVar3 = std::__cxx11::string::compare((char *)&local_2f8);
    bVar2 = iVar3 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  if (!bVar2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x18);
    local_240[0] = local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"Expected opening brace \'{\' after state-name.","");
    plVar5 = (long *)std::__cxx11::string::append((char *)local_240);
    local_320._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_320._M_dataplus._M_p == psVar6) {
      local_320.field_2._M_allocated_capacity = *psVar6;
      local_320.field_2._8_8_ = plVar5[3];
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    }
    else {
      local_320.field_2._M_allocated_capacity = *psVar6;
    }
    local_320._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Parser_Token_Server_Base::RejectToken
              (&local_80,
               (this->tok)._M_t.
               super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ._M_t.
               super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
    token_got_string_abi_cxx11_(&local_220,(EOPlus *)&local_80,t_01);
    std::operator+(&local_200.name,&local_320,&local_220);
    pPVar1 = (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
    iVar3 = pPVar1->line;
    iVar7 = pPVar1->reject_line;
    std::runtime_error::runtime_error(prVar4,(string *)&local_200);
    if (iVar7 < iVar3) {
      iVar7 = iVar3;
    }
    *(int *)(prVar4 + 0x10) = iVar7;
    *(undefined ***)prVar4 = &PTR__runtime_error_001d37c8;
    __cxa_throw(prVar4,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_320._M_dataplus._M_p = local_320._M_dataplus._M_p & 0xffffffffffffff00;
  State::State(&local_200);
  local_2c8 = (code *)0x0;
  pcStack_2c0 = (code *)0x0;
  local_2d8._M_unused._M_object = (void *)0x0;
  local_2d8._8_8_ = 0;
  local_2d8._M_unused._M_object = operator_new(0x18);
  *(string **)local_2d8._M_unused._0_8_ = &local_320;
  *(Parser **)((long)local_2d8._M_unused._0_8_ + 8) = this;
  *(State **)((long)local_2d8._M_unused._0_8_ + 0x10) = &local_200;
  pcStack_2c0 = std::
                _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:450:54)>
                ::_M_invoke;
  local_2c8 = std::
              _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:450:54)>
              ::_M_manager;
  pcStack_250 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:473:5)>
                ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:473:5)>
              ::_M_manager;
  local_268._M_unused._M_object = &local_340;
  local_268._8_8_ = this;
  ParseRuleActionBlock
            (this,&local_200.rules,&local_200.actions,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_2d8,
             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_268);
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,__destroy_functor);
  }
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
  }
  std::__cxx11::string::_M_assign((string *)&local_200);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_EOPlus::State_&,_true>
            (__return_storage_ptr__,&local_340,&local_200);
  std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::~deque(&local_200.actions);
  std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::~deque(&local_200.rules);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.desc._M_dataplus._M_p != &local_200.desc.field_2) {
    operator_delete(local_200.desc._M_dataplus._M_p,local_200.desc.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.name._M_dataplus._M_p != &local_200.name.field_2) {
    operator_delete(local_200.name._M_dataplus._M_p,local_200.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_p != &local_290) {
    operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, State> Parser::ParseStateBlock()
	{
		Token t;

		if (this->GetToken(t, Token::Identifier))
		{
			std::string name = t.data;

			if (this->GetToken(t, Token::Symbol) && std::string(t.data) == "{")
			{
				bool has_desc = false;
				State state;

				ParseRuleActionBlock(state.rules, state.actions, [&](std::string entry) -> bool
				{
					if (entry == "desc")
					{
						if (has_desc)
							PARSER_ERROR("State can only contain one description.");

						has_desc = true;
						state.desc = this->ParseDesc();
						return true;
					}
					else if (entry == "goal")
					{
						Rule rule = this->ParseRule();
						state.rules.push_back(rule);
						state.goal_rule = state.rules.size() - 1;
						return true;
					}
					else
					{
						return false;
					}
				},
				[&](std::string expected)
				{
					PARSER_ERROR_GOT("Expected state-block entry (" + expected + "/goal/desc) or closing brace '}' in state '" + name + "'.");
				});

				state.name = name;
				return std::pair<std::string, State>(name, state);
			}

			PARSER_ERROR_GOT("Expected opening brace '{' after state-name.");
		}

		PARSER_ERROR_GOT("Expected state-name after 'state'.");
	}